

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall Transaction_GetRwUInt64_Test::TestBody(Transaction_GetRwUInt64_Test *this)

{
  mock_database *db;
  _func_int **message;
  shared_ptr<unsigned_long> ptr;
  mock_mutex mutex;
  uint64_t expected;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  
  expected = 0x10000000000;
  db = &(this->super_Transaction).db_;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&ptr,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,&db->super_database,(unique_lock<mock_mutex> *)&ptr);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&ptr);
  pstore::transaction_base::allocate(&transaction.super_transaction_base,8,8);
  pstore::database::getrw<unsigned_long,void>
            ((database *)&ptr,(extent<unsigned_long> *)transaction.super_transaction_base.db_);
  *ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0x10000000000;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  pstore::database::getro<unsigned_long,void>((database *)&ptr,(extent<unsigned_long> *)db);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&transaction,"expected","*db_.getro (extent)",&expected,
             ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&ptr);
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      message = (_func_int **)0x1ec539;
    }
    else {
      message = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x1e5,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&ptr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(*ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  return;
}

Assistant:

TEST_F (Transaction, GetRwUInt64) {
    std::uint64_t const expected = 1ULL << 40;
    pstore::extent<std::uint64_t> extent;
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        {
            // Allocate the storage
            pstore::address const addr =
                transaction.allocate (sizeof (std::uint64_t), alignof (std::uint64_t));
            extent =
                make_extent (pstore::typed_address<std::uint64_t> (addr), sizeof (std::uint64_t));
            std::shared_ptr<std::uint64_t> ptr = transaction.getrw (extent);

            // Save the data to the store
            *(ptr) = expected;
        }
        transaction.commit ();
    }
    EXPECT_EQ (expected, *db_.getro (extent));
}